

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_meta
                   (string *__return_storage_ptr__,MetaVariable *meta,uint32_t indent,
                   bool emit_type_name,string *varname)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  value_type *this;
  ostream *poVar4;
  value *this_00;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_00;
  uint32_t n_01;
  undefined1 closing_brace;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  reference local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_conflict
  *item;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  allocator local_281;
  string local_280;
  string local_260;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_240;
  undefined1 local_208 [8];
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  pv;
  string name;
  stringstream ss;
  ostream aoStack_1a0 [376];
  string *local_28;
  string *varname_local;
  bool emit_type_name_local;
  MetaVariable *pMStack_18;
  uint32_t indent_local;
  MetaVariable *meta_local;
  
  local_28 = varname;
  varname_local._3_1_ = emit_type_name;
  varname_local._4_4_ = indent;
  pMStack_18 = meta;
  meta_local = (MetaVariable *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(name.field_2._M_local_buf + 8));
  closing_brace = SUB81(varname,0);
  psVar2 = MetaVariable::get_name_abi_cxx11_(pMStack_18);
  ::std::__cxx11::string::string((string *)((long)&pv.contained + 0x28),(string *)psVar2);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    ::std::__cxx11::string::operator=((string *)((long)&pv.contained + 0x28),(string *)local_28);
  }
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    ::std::__cxx11::string::operator=((string *)((long)&pv.contained + 0x28),"[ERROR:EmptyName]");
  }
  MetaVariable::
  get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
            (&local_240,pMStack_18);
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  ::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>,_0>
            ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              *)local_208,&local_240);
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  ::~optional(&local_240);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_208);
  if (bVar1) {
    bVar1 = isValidIdentifier((string *)((long)&pv.contained + 0x28),true);
    n_00 = extraout_EDX;
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_280,"\"",&local_281);
      quote(&local_260,(string *)((long)&pv.contained + 0x28),&local_280);
      ::std::__cxx11::string::operator=((string *)((long)&pv.contained + 0x28),(string *)&local_260)
      ;
      ::std::__cxx11::string::~string((string *)&local_260);
      ::std::__cxx11::string::~string((string *)&local_280);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
      n_00 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_((string *)&__range2,(pprint *)(ulong)varname_local._4_4_,n_00);
    poVar4 = ::std::operator<<(aoStack_1a0,(string *)&__range2);
    poVar4 = ::std::operator<<(poVar4,"dictionary ");
    poVar4 = ::std::operator<<(poVar4,(string *)((long)&pv.contained + 0x28));
    ::std::operator<<(poVar4," = {\n");
    ::std::__cxx11::string::~string((string *)&__range2);
    this = nonstd::optional_lite::
           optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
           ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    *)local_208);
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
             ::begin(this);
    item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::end(this);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&item), bVar1) {
      local_2c8 = ::std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
                  ::operator*(&__end2);
      print_meta(&local_2e8,&local_2c8->second,varname_local._4_4_ + 1,true,(string *)local_2c8);
      ::std::operator<<(aoStack_1a0,(string *)&local_2e8);
      ::std::__cxx11::string::~string((string *)&local_2e8);
      ::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
      ::operator++(&__end2);
    }
    pprint::Indent_abi_cxx11_(&local_308,(pprint *)(ulong)varname_local._4_4_,n_01);
    poVar4 = ::std::operator<<(aoStack_1a0,(string *)&local_308);
    ::std::operator<<(poVar4,"}\n");
    ::std::__cxx11::string::~string((string *)&local_308);
  }
  else {
    pprint::Indent_abi_cxx11_(&local_328,(pprint *)(ulong)varname_local._4_4_,n);
    ::std::operator<<(aoStack_1a0,(string *)&local_328);
    ::std::__cxx11::string::~string((string *)&local_328);
    if ((varname_local._3_1_ & 1) != 0) {
      MetaVariable::type_name_abi_cxx11_(&local_348,pMStack_18);
      poVar4 = ::std::operator<<(aoStack_1a0,(string *)&local_348);
      ::std::operator<<(poVar4," ");
      ::std::__cxx11::string::~string((string *)&local_348);
    }
    poVar4 = ::std::operator<<(aoStack_1a0,(string *)((long)&pv.contained + 0x28));
    poVar4 = ::std::operator<<(poVar4," = ");
    this_00 = (value *)MetaVariable::get_raw_value(pMStack_18);
    value::pprint_value_abi_cxx11_(&local_368,this_00,(Value *)0x0,1,(bool)closing_brace);
    poVar4 = ::std::operator<<(poVar4,(string *)&local_368);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::~string((string *)&local_368);
  }
  nonstd::optional_lite::
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  ::~optional((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               *)local_208);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x28));
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string print_meta(const MetaVariable &meta, const uint32_t indent, bool emit_type_name,
                       const std::string &varname) {
  std::stringstream ss;

  // ss << "TODO: isObject " << meta.is_object() << ", isValue " <<
  // meta.IsValue() << "\n";

  // Use varname if meta.name is empty
  std::string name = meta.get_name();
  if (name.empty()) {
    name = varname;
  }

  if (name.empty()) {
    name = "[ERROR:EmptyName]";
  }

  if (auto pv = meta.get_value<CustomDataType>()) {
    // dict
    if (!isValidIdentifier(name)) {
      // May contain "/", quote it
      name = quote(name);
    }
    ss << pprint::Indent(indent) << "dictionary " << name << " = {\n";
    for (const auto &item : pv.value()) {
      ss << print_meta(item.second, indent + 1, /* emit_type_name */true, item.first);
    }
    ss << pprint::Indent(indent) << "}\n";
  } else {
    ss << pprint::Indent(indent);
    if (emit_type_name) {
      ss << meta.type_name() << " ";
    }
    ss << name << " = "
       << pprint_value(meta.get_raw_value()) << "\n";
  }

  return ss.str();
}